

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::Descriptor::ExtensionRange::CopyTo
          (ExtensionRange *this,DescriptorProto_ExtensionRange *proto)

{
  ExtensionRangeOptions *pEVar1;
  ExtensionRangeOptions *pEVar2;
  DescriptorProto_ExtensionRange *proto_local;
  ExtensionRange *this_local;
  
  DescriptorProto_ExtensionRange::set_start(proto,this->start_);
  DescriptorProto_ExtensionRange::set_end(proto,this->end_);
  pEVar1 = this->options_;
  pEVar2 = ExtensionRangeOptions::default_instance();
  if (pEVar1 != pEVar2) {
    pEVar1 = this->options_;
    pEVar2 = DescriptorProto_ExtensionRange::mutable_options(proto);
    ExtensionRangeOptions::operator=(pEVar2,pEVar1);
  }
  anon_unknown_24::RestoreFeaturesToOptions<google::protobuf::DescriptorProto_ExtensionRange>
            (this->proto_features_,proto);
  return;
}

Assistant:

void Descriptor::ExtensionRange::CopyTo(
    DescriptorProto_ExtensionRange* proto) const {
  proto->set_start(start_);
  proto->set_end(end_);
  if (options_ != &ExtensionRangeOptions::default_instance()) {
    *proto->mutable_options() = *options_;
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}